

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O1

void __thiscall MobileElementManager::Insert(MobileElementManager *this,Ptr *pol,Ptr *polymer)

{
  int iVar1;
  _Rb_tree_color _Var2;
  const_iterator cVar3;
  pointer ppVar4;
  pointer pdVar5;
  pointer pdVar6;
  _Base_ptr p_Var7;
  int iVar8;
  SpeciesTracker *pSVar9;
  const_iterator cVar10;
  const_iterator cVar11;
  runtime_error *this_00;
  ulong uVar12;
  _Base_ptr p_Var13;
  MobileElementManager *pMVar14;
  const_iterator __position;
  Ptr *pPVar15;
  difference_type __d;
  ulong uVar16;
  string codon;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_> pol_polymer;
  double local_b0;
  key_type local_a0;
  Ptr *local_80;
  MobileElementManager *local_78;
  undefined1 local_70 [32];
  pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_> local_50;
  
  local_80 = pol;
  std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>::
  pair<std::shared_ptr<MobileElement>_&,_std::shared_ptr<Polymer>_&,_true>(&local_50,pol,polymer);
  cVar3._M_current =
       (this->polymerases_).
       super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  uVar12 = (long)(this->polymerases_).
                 super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)cVar3._M_current >> 5;
  local_78 = this;
  while (__position._M_current = cVar3._M_current, pMVar14 = local_78, pPVar15 = local_80,
        0 < (long)uVar12) {
    uVar16 = uVar12 >> 1;
    std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>::pair
              ((pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_> *)&local_a0,
               &local_50);
    std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>::pair
              ((pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_> *)local_70,
               __position._M_current + uVar16);
    iVar8 = *(int *)(local_a0._M_dataplus._M_p + 0x38);
    iVar1 = *(int *)(local_70._0_8_ + 0x38);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._24_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.field_2._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.field_2._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length);
    }
    uVar12 = uVar12 + ~uVar16;
    cVar3._M_current = __position._M_current + uVar16 + 1;
    if (iVar8 < iVar1) {
      uVar12 = uVar16;
      cVar3._M_current = __position._M_current;
    }
  }
  ppVar4 = (local_78->polymerases_).
           super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar5 = (local_78->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>::
  pair<std::shared_ptr<MobileElement>_&,_std::shared_ptr<Polymer>_&,_true>
            ((pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_> *)&local_a0,local_80,
             polymer);
  std::
  vector<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
  ::_M_insert_rval(&this->polymerases_,__position,(value_type *)&local_a0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.field_2._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.field_2._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_string_length);
  }
  pSVar9 = SpeciesTracker::Instance();
  iVar8 = std::__cxx11::string::compare
                    ((char *)&((pPVar15->
                               super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                              )->name_);
  if ((iVar8 == 0) && ((pSVar9->codon_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0))
  {
    std::__cxx11::string::substr((ulong)&local_a0,(ulong)&pMVar14->seq_);
    cVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::find(&(pSVar9->codon_map_)._M_t,&local_a0);
    p_Var13 = *(_Base_ptr *)(cVar10._M_node + 2);
    p_Var7 = cVar10._M_node[2]._M_parent;
    if (p_Var13 == p_Var7) {
      local_b0 = 0.0;
    }
    else {
      local_b0 = 0.0;
      do {
        local_70._0_8_ = (element_type *)(local_70 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_70,*(long *)p_Var13,
                   (long)&p_Var13->_M_parent->_M_color + *(long *)p_Var13);
        std::__cxx11::string::append((char *)local_70);
        cVar11 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::find(&(pSVar9->species_)._M_t,(key_type *)local_70);
        _Var2 = cVar11._M_node[2]._M_color;
        if ((element_type *)local_70._0_8_ != (element_type *)(local_70 + 0x10)) {
          operator_delete((void *)local_70._0_8_);
        }
        local_b0 = local_b0 + (double)(int)_Var2;
        p_Var13 = p_Var13 + 1;
      } while (p_Var13 != p_Var7);
    }
    pMVar14 = local_78;
    pPVar15 = local_80;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
      pMVar14 = local_78;
      pPVar15 = local_80;
    }
  }
  else {
    iVar8 = std::__cxx11::string::compare
                      ((char *)&((pPVar15->
                                 super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr)->name_);
    local_b0 = 1.0;
    if ((iVar8 == 0) &&
       (pdVar6 = (pMVar14->weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
       pdVar6 != (pMVar14->weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish)) {
      local_b0 = pdVar6[(long)((pPVar15->
                               super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                              )->stop_ + -1] + 0.0;
    }
  }
  local_a0._M_dataplus._M_p =
       (pointer)(local_b0 *
                ((pPVar15->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                speed_);
  pMVar14->prop_sum_ = pMVar14->prop_sum_ + (double)local_a0._M_dataplus._M_p;
  std::vector<double,_std::allocator<double>_>::_M_insert_rval
            (&pMVar14->prop_list_,
             (double *)(((long)__position._M_current - (long)ppVar4 >> 2) + (long)pdVar5),
             (value_type_conflict1 *)&local_a0);
  if ((long)(pMVar14->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pMVar14->prop_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 ==
      (long)(pMVar14->polymerases_).
            super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(pMVar14->polymerases_).
            super__Vector_base<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>,_std::allocator<std::pair<std::shared_ptr<MobileElement>,_std::shared_ptr<Polymer>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5) {
    iVar8 = std::__cxx11::string::compare
                      ((char *)&((pPVar15->
                                 super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr)->name_);
    if (iVar8 != 0) {
      pMVar14->pol_count_ = pMVar14->pol_count_ + 1;
    }
    if (local_50.second.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.second.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
    if (local_50.first.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.first.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Prop list not correct size.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MobileElementManager::Insert(MobileElement::Ptr pol,
                                  Polymer::Ptr polymer) {
  // Find where in vector polymerase should insert; use a lambda function
  // to make comparison between polymerase pointers
  auto pol_polymer = std::make_pair(pol, polymer);
  auto it =
      std::upper_bound(polymerases_.begin(), polymerases_.end(), pol_polymer,
                       [](std::pair<MobileElement::Ptr, Polymer::Ptr> a,
                          std::pair<MobileElement::Ptr, Polymer::Ptr> b) {
                         return a.first->start() < b.first->start();
                       });
  // Record position for prop_list_
  // NOTE: iterators become invalid as soon as a vector is changed!!
  // Attempting to use an iterator twice will lead to a segfault.
  auto prop_it = (it - polymerases_.begin()) + prop_list_.begin();
  // Add polymerase to this polymer
  polymerases_.insert(it, std::make_pair(pol, polymer));
  
  //Set propensity
  double weight = 1;
  auto &tracker = SpeciesTracker::Instance();
  if (pol->name() == "__ribosome" && !tracker.codon_map().empty()) { 
    weight--;
    /**
     * Steps:
     * 1. get pol position, codon from indexing sequence
     * 2. get anticodon(s) from codon-anticodon map
     * 3. get the total number of available tRNAs
     */
    std::string codon = seq_.substr(pol->stop(), 3);
    //std::cout << codon << std::endl;
    //std::cout << pol->stop() << std::endl;
    auto anticodons = tracker.codon_map().find(codon);
    for (auto const& anticodon : anticodons->second) {
      //std::cout << anticodon << std::endl;
      weight += tracker.species().find(anticodon + "_charged")->second;
    } 
  } else if (pol->name() == "__ribosome" && !weights_.empty()) {
      weight--;
      // weight propensity by index
      weight += weights_[pol->stop() - 1];
  }
  // Update total move propensity of this polymer
  prop_sum_ += weight * pol->speed();
  prop_list_.insert(prop_it, weight * pol->speed());

  if (prop_list_.size() != polymerases_.size()) {
    throw std::runtime_error("Prop list not correct size.");
  }
  // Keep running count of non-RNAse mobile elements
  if (pol->name() != "__rnase") {
    pol_count_ += 1;
  }
}